

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O1

int Cec_ManSeqResimulate(Cec_ManSim_t *p,Vec_Ptr_t *vInfo)

{
  Gia_Man_t *pGVar1;
  void *pvVar2;
  void *pvVar3;
  Vec_Int_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  
  pGVar1 = p->pAig;
  if (vInfo->nSize != (pGVar1->vCis->nSize - pGVar1->nRegs) * p->pPars->nFrames + pGVar1->nRegs) {
    __assert_fail("Vec_PtrSize(vInfo) == Gia_ManRegNum(p->pAig) + Gia_ManPiNum(p->pAig) * p->pPars->nFrames"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                  ,0x8e,"int Cec_ManSeqResimulate(Cec_ManSim_t *, Vec_Ptr_t *)");
  }
  uVar8 = (ulong)(uint)pGVar1->nRegs;
  uVar16 = 0;
  if (0 < pGVar1->nRegs) {
    do {
      if ((((long)vInfo->nSize <= (long)uVar16) ||
          (uVar9 = (int)uVar16 + (pGVar1->vCos->nSize - (int)uVar8), (int)uVar9 < 0)) ||
         (p->vCoSimInfo->nSize <= (int)uVar9)) {
LAB_00654685:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (0 < p->nWords) {
        pvVar2 = vInfo->pArray[uVar16];
        pvVar3 = p->vCoSimInfo->pArray[uVar9];
        lVar10 = 0;
        do {
          *(undefined4 *)((long)pvVar3 + lVar10 * 4) = *(undefined4 *)((long)pvVar2 + lVar10 * 4);
          lVar10 = lVar10 + 1;
        } while (lVar10 < p->nWords);
      }
      uVar16 = uVar16 + 1;
      uVar8 = (ulong)pGVar1->nRegs;
    } while ((long)uVar16 < (long)uVar8);
  }
  iVar15 = (int)uVar16;
  if (0 < p->pPars->nFrames) {
    iVar14 = 0;
    do {
      pGVar1 = p->pAig;
      pVVar4 = pGVar1->vCis;
      if (pGVar1->nRegs < pVVar4->nSize) {
        uVar8 = uVar16 & 0xffffffff;
        lVar10 = 0;
        do {
          if ((((int)uVar16 < 0) || (vInfo->nSize <= (int)uVar8)) ||
             (p->vCiSimInfo->nSize <= lVar10)) goto LAB_00654685;
          if (0 < p->nWords) {
            pvVar2 = vInfo->pArray[uVar8];
            pvVar3 = p->vCiSimInfo->pArray[lVar10];
            lVar12 = 0;
            do {
              *(undefined4 *)((long)pvVar3 + lVar12 * 4) =
                   *(undefined4 *)((long)pvVar2 + lVar12 * 4);
              lVar12 = lVar12 + 1;
            } while (lVar12 < p->nWords);
          }
          uVar8 = uVar8 + 1;
          lVar10 = lVar10 + 1;
        } while (lVar10 < (long)pVVar4->nSize - (long)pGVar1->nRegs);
        uVar16 = uVar8 & 0xffffffff;
      }
      iVar15 = (int)uVar16;
      iVar7 = pGVar1->nRegs;
      if (0 < iVar7) {
        pVVar5 = p->vCoSimInfo;
        pVVar6 = pGVar1->vCos;
        iVar11 = 0;
        do {
          uVar9 = (pVVar6->nSize - iVar7) + iVar11;
          if ((((int)uVar9 < 0) || (pVVar5->nSize <= (int)uVar9)) ||
             ((uVar13 = (pVVar4->nSize - iVar7) + iVar11, (int)uVar13 < 0 ||
              (p->vCiSimInfo->nSize <= (int)uVar13)))) goto LAB_00654685;
          if (0 < p->nWords) {
            pvVar2 = pVVar5->pArray[uVar9];
            pvVar3 = p->vCiSimInfo->pArray[uVar13];
            lVar10 = 0;
            do {
              *(undefined4 *)((long)pvVar3 + lVar10 * 4) =
                   *(undefined4 *)((long)pvVar2 + lVar10 * 4);
              lVar10 = lVar10 + 1;
            } while (lVar10 < p->nWords);
          }
          iVar11 = iVar11 + 1;
          iVar7 = pGVar1->nRegs;
        } while (iVar11 < iVar7);
      }
      iVar7 = Cec_ManSimSimulateRound(p,p->vCiSimInfo,p->vCoSimInfo);
      if (iVar7 != 0) {
        return 1;
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < p->pPars->nFrames);
  }
  if (iVar15 == vInfo->nSize) {
    return 0;
  }
  __assert_fail("k == Vec_PtrSize(vInfo)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                ,0xa9,"int Cec_ManSeqResimulate(Cec_ManSim_t *, Vec_Ptr_t *)");
}

Assistant:

int Cec_ManSeqResimulate( Cec_ManSim_t * p, Vec_Ptr_t * vInfo )
{
    unsigned * pInfo0, * pInfo1;
    int f, i, k, w;
//    assert( Gia_ManRegNum(p->pAig) > 0 );
    assert( Vec_PtrSize(vInfo) == Gia_ManRegNum(p->pAig) + Gia_ManPiNum(p->pAig) * p->pPars->nFrames );
    for ( k = 0; k < Gia_ManRegNum(p->pAig); k++ )
    {
        pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, k );
        pInfo1 = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, Gia_ManPoNum(p->pAig) + k );
        for ( w = 0; w < p->nWords; w++ )
            pInfo1[w] = pInfo0[w];
    }
    for ( f = 0; f < p->pPars->nFrames; f++ )
    {
        for ( i = 0; i < Gia_ManPiNum(p->pAig); i++ )
        {
            pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, k++ );
            pInfo1 = (unsigned *)Vec_PtrEntry( p->vCiSimInfo, i );
            for ( w = 0; w < p->nWords; w++ )
                pInfo1[w] = pInfo0[w];
        }
        for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        {
            pInfo0 = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, Gia_ManPoNum(p->pAig) + i );
            pInfo1 = (unsigned *)Vec_PtrEntry( p->vCiSimInfo, Gia_ManPiNum(p->pAig) + i );
            for ( w = 0; w < p->nWords; w++ )
                pInfo1[w] = pInfo0[w];
        }
        if ( Cec_ManSimSimulateRound( p, p->vCiSimInfo, p->vCoSimInfo ) )
            return 1;
    }
    assert( k == Vec_PtrSize(vInfo) );
    return 0;
}